

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::StringPtr&,char_const(&)[3],kj::String&>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char (*params_1) [3],
          String *params_2)

{
  StringPtr *value;
  char (*value_00) [3];
  String *value_01;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  String *local_28;
  String *params_local_2;
  char (*params_local_1) [3];
  StringPtr *params_local;
  
  local_28 = (String *)params_1;
  params_local_2 = (String *)params;
  params_local_1 = (char (*) [3])this;
  params_local = (StringPtr *)__return_storage_ptr__;
  value = fwd<kj::StringPtr&>((StringPtr *)this);
  local_38 = toCharSequence<kj::StringPtr&>(value);
  value_00 = ::const((char (*) [3])params_local_2);
  local_48 = toCharSequence<char_const(&)[3]>(value_00);
  value_01 = fwd<kj::String&>(local_28);
  local_58 = toCharSequence<kj::String&>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}